

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O0

size_t __thiscall
adios2::format::BP4Serializer::CloseStream(BP4Serializer *this,IO *io,bool addMetadata)

{
  long lVar1;
  byte updateAbsolutePosition;
  mapped_type *pmVar2;
  byte in_DL;
  BP4Serializer *in_RSI;
  long *in_RDI;
  string *in_stack_00000028;
  IOChrono *in_stack_00000030;
  size_t dataEndsAt;
  key_type *in_stack_ffffffffffffff08;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff10;
  string *process;
  IOChrono *this_00;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  size_t local_58;
  IO *in_stack_ffffffffffffffc8;
  BP4Serializer *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffee;
  
  updateAbsolutePosition = in_DL & 1;
  process = (string *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x278);
  this_00 = (IOChrono *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,"buffering",(allocator *)this_00);
  profiling::IOChrono::Start(in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1c0) & 1) != 0) {
    SerializeDataBuffer(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  local_58 = *(size_t *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60);
  SerializeMetadataInData(in_RSI,(bool)updateAbsolutePosition,(bool)in_stack_ffffffffffffffee);
  if ((*(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x2e8) & 1) != 0) {
    lVar1 = *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x60);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"buffering",&local_79);
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::at(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    *pmVar2 = lVar1 + *pmVar2;
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"buffering",&local_a1);
  profiling::IOChrono::Stop(this_00,process);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return local_58;
}

Assistant:

size_t BP4Serializer::CloseStream(core::IO &io, const bool addMetadata)
{
    m_Profiler.Start("buffering");
    if (m_MetadataSet.DataPGIsOpen)
    {
        SerializeDataBuffer(io);
    }
    size_t dataEndsAt = m_Data.m_Position;
    SerializeMetadataInData(false, addMetadata);

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.at("buffering") += m_Data.m_Position;
    }
    m_Profiler.Stop("buffering");

    return dataEndsAt;
}